

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O2

_Bool borg_use_unknown(void)

{
  char *what;
  uint8_t *puVar1;
  ulong uVar2;
  wchar_t wVar3;
  ulong uVar4;
  
  puVar1 = &borg_items->iqty;
  uVar4 = 0xffffffffffffffff;
  for (uVar2 = 0; z_info->pack_size != uVar2; uVar2 = uVar2 + 1) {
    if (((*puVar1 != '\0') && (puVar1[-4] == '\x16')) &&
       (uVar4 = uVar4 & 0xffffffff, *(uint32_t *)(puVar1 + -0xc) == 0)) {
      uVar4 = uVar2 & 0xffffffff;
    }
    puVar1 = puVar1 + 0x388;
  }
  wVar3 = (wchar_t)uVar4;
  if (L'\xffffffff' < wVar3) {
    what = format("# Using unknown Staff %s.",borg_items + (uVar4 & 0xffffffff));
    borg_note(what);
    borg_zap_slot = wVar3;
    borg_keypress(0x75);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar4 & 0xffffffff]);
    borg_keypress(0xe000);
  }
  return L'\xffffffff' < wVar3;
}

Assistant:

bool borg_use_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_STAFF)
            continue;

        /* Skip aware items */
        if (item->kind)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return (false);

    /* Log the message */
    borg_note(format("# Using unknown Staff %s.", borg_items[n].desc));

    /* record the address to avoid certain bugs with inscriptions&amnesia */
    borg_zap_slot = n;

    /* Perform the action */
    borg_keypress('u');
    borg_keypress(all_letters_nohjkl[n]);

    /* Incase it is ID staff, ESCAPE out. */
    borg_keypress(ESCAPE);

    /* Success */
    return (true);
}